

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtexture.cpp
# Opt level: O3

boolean FLumpSourceMgr::FillInputBuffer(j_decompress_ptr cinfo)

{
  jpeg_source_mgr *pjVar1;
  size_t sVar2;
  
  pjVar1 = cinfo->src;
  sVar2 = (**(code **)(*(long *)pjVar1[1].next_input_byte + 0x10))
                    (pjVar1[1].next_input_byte,&pjVar1[1].bytes_in_buffer,0x1000);
  if ((long)sVar2 < 1) {
    *(undefined2 *)&pjVar1[1].bytes_in_buffer = 0xd9ff;
    sVar2 = 2;
  }
  pjVar1->next_input_byte = (JOCTET *)&pjVar1[1].bytes_in_buffer;
  pjVar1->bytes_in_buffer = sVar2;
  *(undefined1 *)&pjVar1[0x4a].init_source = 0;
  return 1;
}

Assistant:

boolean FLumpSourceMgr::FillInputBuffer (j_decompress_ptr cinfo)
{
	FLumpSourceMgr *me = (FLumpSourceMgr *)(cinfo->src);
	long nbytes = me->Lump->Read (me->Buffer, sizeof(me->Buffer));

	if (nbytes <= 0)
	{
		me->Buffer[0] = (JOCTET)0xFF;
		me->Buffer[1] = (JOCTET)JPEG_EOI;
		nbytes = 2;
	}
	me->next_input_byte = me->Buffer;
	me->bytes_in_buffer = nbytes;
	me->StartOfFile = false;
	return TRUE;
}